

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     operate<andres::marray_detail::TimesEqual<int,int>,int,int,true,std::allocator<unsigned_long>>
               (View<int,_false,_std::allocator<unsigned_long>_> *v,
               View<int,_true,_std::allocator<unsigned_long>_> *w)

{
  CoordinateOrder CVar1;
  reference piVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  runtime_error *this;
  reference piVar6;
  reference piVar7;
  reference piVar8;
  int *piVar9;
  int *piVar10;
  reference piVar11;
  reference piVar12;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar13;
  Marray<int,_std::allocator<unsigned_long>_> m;
  const_iterator itW;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_a8;
  long local_78;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_60;
  
  if (((v->geometry_).size_ == 0) || ((w->geometry_).size_ == 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
LAB_002069b8:
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_002069b8;
  }
  sVar4 = (w->geometry_).dimension_;
  if (sVar4 != 0) {
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002069b8;
    }
    if ((v->geometry_).dimension_ != sVar4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002069b8;
    }
    if (sVar4 != 0) {
      if (v->data_ != (pointer)0x0) {
        uVar13 = 0;
        do {
          if ((v->geometry_).dimension_ <= uVar13) goto LAB_00206135;
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,uVar13);
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(w,uVar13);
          if (sVar4 != sVar5) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_002069b8;
          }
          uVar13 = uVar13 + 1;
        } while (v->data_ != (pointer)0x0);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002069b8;
    }
  }
LAB_00206135:
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_002069b8;
  }
  if ((w->geometry_).dimension_ == 0) {
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    local_60.view_._0_4_ = *piVar7;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    if ((v->geometry_).isSimple_ == true) {
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar4 = (v->geometry_).size_;
      if (sVar4 == 0) {
        return;
      }
      sVar5 = 0;
      do {
        piVar8[sVar5] = piVar8[sVar5] * (int)local_60.view_;
        sVar5 = sVar5 + 1;
      } while (sVar4 != sVar5);
      return;
    }
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002069b8;
    }
    switch((v->geometry_).dimension_) {
    case 1:
      local_a8.view_._0_4_ = 0;
      piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar4 != 0) {
        uVar13 = 0;
        do {
          *piVar9 = *piVar9 * (int)local_60.view_;
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          piVar9 = piVar9 + sVar4;
          uVar13 = uVar13 + 1;
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar13 < sVar4);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      sVar4 = 0;
      break;
    case 2:
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_60,piVar8);
      return;
    case 3:
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      if (sVar4 != 0) {
        uVar13 = 0;
        do {
          OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(v,&local_60,piVar8);
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,2);
          piVar8 = piVar8 + sVar4;
          uVar13 = uVar13 + 1;
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
        } while (uVar13 < sVar4);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      sVar4 = 2;
      break;
    case 4:
      local_a8.view_._0_4_ = 0;
      piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_60,piVar8);
      return;
    default:
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 5) {
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar8);
        return;
      }
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 6) {
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar8);
        return;
      }
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 7) {
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar8);
        return;
      }
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 8) {
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar8);
        return;
      }
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 9) {
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar8);
        return;
      }
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 10) {
        local_a8.view_._0_4_ = 0;
        piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,piVar8);
        return;
      }
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
      Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
      while (bVar3 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8), bVar3
            ) {
        piVar11 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
        *piVar11 = *piVar11 * (int)local_60.view_;
        Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
      }
      goto LAB_00206908;
    }
    View<int,_false,_std::allocator<unsigned_long>_>::strides(v,sVar4);
    return;
  }
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(w);
  piVar8 = v->data_;
  if ((piVar8 != (reference)0x0) && (piVar2 = w->data_, piVar2 != (reference)0x0)) {
    piVar6 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()(w,(w->geometry_).size_ - 1)
    ;
    if (((piVar8 <= piVar2) && (piVar2 <= piVar6)) || ((piVar2 <= piVar8 && (piVar8 <= piVar7)))) {
      Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_a8,w);
      operate<andres::marray_detail::TimesEqual<int,int>,int,int,false,std::allocator<unsigned_long>>
                (v,&local_a8);
      operator_delete((void *)CONCAT44(local_a8.view_._4_4_,local_a8.view_._0_4_),local_78 << 2);
      uVar13 = (long)local_a8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * 0x18;
      goto LAB_002061e0;
    }
  }
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  CVar1 = (v->geometry_).coordinateOrder_;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(w);
  if ((CVar1 == (w->geometry_).coordinateOrder_) &&
     ((View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v),
      (v->geometry_).isSimple_ == true &&
      (View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(w),
      (w->geometry_).isSimple_ == true)))) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    sVar4 = (v->geometry_).size_;
    if (sVar4 == 0) {
      return;
    }
    sVar5 = 0;
    do {
      piVar8[sVar5] = piVar8[sVar5] * piVar7[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
    return;
  }
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_002069b8;
  }
  switch((v->geometry_).dimension_) {
  case 1:
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar10 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                        (w,(int *)&local_a8);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    if (sVar4 != 0) {
      uVar13 = 0;
      do {
        *piVar9 = *piVar9 * *piVar10;
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
        piVar9 = piVar9 + sVar4;
        sVar4 = View<int,_true,_std::allocator<unsigned_long>_>::strides(w,0);
        piVar10 = piVar10 + sVar4;
        uVar13 = uVar13 + 1;
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      } while (uVar13 < sVar4);
    }
    View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
    View<int,_true,_std::allocator<unsigned_long>_>::shape(w,0);
    View<int,_true,_std::allocator<unsigned_long>_>::strides(w,0);
    return;
  case 2:
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  case 3:
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  case 4:
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 5) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 6) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 7) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 8) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 9) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 10) {
    local_a8.view_._0_4_ = 0;
    piVar8 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar7 = AccessOperatorHelper<true>::execute<int,int,true,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,piVar8,piVar7);
    return;
  }
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(w);
  Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_60,w,0);
  while (bVar3 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8), bVar3) {
    bVar3 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_60);
    Assert<bool>(bVar3);
    piVar11 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
    piVar12 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&local_60);
    *piVar11 = *piVar11 * *piVar12;
    Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
    Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_60);
  }
  bVar3 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_60);
  Assert<bool>(!bVar3);
  if (local_60.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00206908:
  if (local_a8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return;
  }
  uVar13 = (long)local_a8.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage -
           (long)local_a8.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_a8.index_ =
       (size_t)local_a8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_002061e0:
  operator_delete((void *)local_a8.index_,uVar13);
  return;
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}